

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O0

bool __thiscall edk2_vss_t::vss_variable_t::is_intel_legacy(vss_variable_t *this)

{
  byte bVar1;
  uint8_t uVar2;
  bool local_21;
  vss_variable_t *this_local;
  
  if ((this->f_is_intel_legacy & 1U) == 0) {
    uVar2 = state(this);
    local_21 = true;
    if (uVar2 != 0xf8) {
      uVar2 = state(this);
      local_21 = uVar2 == 0xfc;
    }
    this->m_is_intel_legacy = local_21;
    this->f_is_intel_legacy = true;
    bVar1 = this->m_is_intel_legacy;
  }
  else {
    bVar1 = this->m_is_intel_legacy;
  }
  this_local._7_1_ = (bool)(bVar1 & 1);
  return this_local._7_1_;
}

Assistant:

bool edk2_vss_t::vss_variable_t::is_intel_legacy() {
    if (f_is_intel_legacy)
        return m_is_intel_legacy;
    m_is_intel_legacy =  ((state() == 248) || (state() == 252)) ;
    f_is_intel_legacy = true;
    return m_is_intel_legacy;
}